

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O0

void __thiscall MatroskaDemuxer::openFile(MatroskaDemuxer *this,string *streamName)

{
  AbstractReader *pAVar1;
  uint uVar2;
  undefined8 uVar3;
  ostream *poVar4;
  VodCoreException *this_00;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream ss;
  string *streamName_local;
  MatroskaDemuxer *this_local;
  
  readClose(this);
  pAVar1 = (this->super_IOContextDemuxer).m_bufferedReader;
  uVar2 = (this->super_IOContextDemuxer).m_readerID;
  uVar3 = std::__cxx11::string::c_str();
  uVar2 = (*pAVar1->_vptr_AbstractReader[8])(pAVar1,(ulong)uVar2,uVar3,0,0);
  if ((uVar2 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    poVar4 = std::operator<<((ostream *)local_190,"Can\'t open stream ");
    std::operator<<(poVar4,(string *)streamName);
    this_00 = (VodCoreException *)__cxa_allocate_exception(0x28);
    std::__cxx11::ostringstream::str();
    VodCoreException::VodCoreException(this_00,100,&local_1c0);
    __cxa_throw(this_00,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  (this->super_IOContextDemuxer).m_bufEnd = (uint8_t *)0x0;
  (this->super_IOContextDemuxer).m_curPos = (uint8_t *)0x0;
  (this->super_IOContextDemuxer).m_processedBytes = 0;
  (this->super_IOContextDemuxer).m_isEOF = false;
  this->num_levels = 0;
  this->level_up = 0;
  this->peek_id = 0;
  this->done = false;
  this->num_streams = 0;
  this->segment_start = 0;
  this->time_scale = 0;
  std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::clear
            (&this->m_firstTimecode);
  this->index_parsed = false;
  this->metadata_parsed = false;
  this->writing_app = (char *)0x0;
  this->muxing_app = (char *)0x0;
  (this->super_IOContextDemuxer).num_tracks = 0;
  matroska_read_header(this);
  return;
}

Assistant:

void MatroskaDemuxer::openFile(const std::string &streamName)
{
    readClose();
    if (!m_bufferedReader->openStream(m_readerID, streamName.c_str()))
        THROW(ERR_FILE_NOT_FOUND, "Can't open stream " << streamName)
    m_curPos = m_bufEnd = nullptr;
    m_processedBytes = 0;
    m_isEOF = false;

    num_levels = 0;
    level_up = 0;
    peek_id = 0;
    done = false;
    num_streams = 0;

    segment_start = 0;
    time_scale = 0;
    m_firstTimecode.clear();
    index_parsed = false;
    metadata_parsed = false;

    writing_app = nullptr;
    muxing_app = nullptr;
    num_tracks = 0;
    matroska_read_header();
}